

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::anon_unknown_0::HasExtension(Descriptor *descriptor)

{
  bool bVar1;
  ulong uVar2;
  Descriptor *descriptor_00;
  ulong uVar3;
  
  bVar1 = true;
  if (*(int *)(descriptor + 0x78) < 1) {
    uVar3 = (ulong)*(int *)(descriptor + 0x48);
    if ((long)uVar3 < 1) {
      bVar1 = false;
    }
    else {
      descriptor_00 = *(Descriptor **)(descriptor + 0x50);
      uVar2 = 0;
      do {
        bVar1 = HasExtension(descriptor_00);
        if (bVar1) {
          return true;
        }
        uVar2 = uVar2 + 1;
        descriptor_00 = descriptor_00 + 0xa8;
      } while (uVar3 != uVar2);
      bVar1 = uVar2 < uVar3;
    }
  }
  return bVar1;
}

Assistant:

bool HasExtension(const Descriptor* descriptor) {
  if (descriptor->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasExtension(descriptor->nested_type(i))) {
      return true;
    }
  }
  return false;
}